

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O0

uint emtglbl(emtcxdef *ctx)

{
  uint uVar1;
  long in_RDI;
  uint ret;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar1 = (uint)*(ushort *)(in_RDI + 0x24);
  if (*(short *)(in_RDI + 0x24) == -1) {
    errsigf((errcxdef *)(ulong)CONCAT24(*(ushort *)(in_RDI + 0x24),in_stack_fffffffffffffff0),
            in_stack_ffffffffffffffe8,0);
  }
  *(undefined2 *)(in_RDI + 0x24) = *(undefined2 *)(in_RDI + 0x26 + (ulong)uVar1 * 6);
  *(undefined2 *)(in_RDI + 0x26 + (ulong)uVar1 * 6) = 0xffff;
  *(undefined1 *)(in_RDI + (ulong)uVar1 * 6 + 0x2a) = 0;
  return uVar1;
}

Assistant:

uint emtglbl(emtcxdef *ctx)
{
    uint ret = ctx->emtcxlfre;

    if (ctx->emtcxlfre == EMTLLNKEND) errsig(ctx->emtcxerr, ERR_NOLBL);
    ctx->emtcxlfre = ctx->emtcxlbl[ret].emtllnk;
    ctx->emtcxlbl[ret].emtllnk = EMTLLNKEND;     /* nothing in label's list */
    ctx->emtcxlbl[ret].emtlflg = 0;                 /* label is not yet set */
    return(ret);
}